

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<float> min,WrappedFloatType<float> max,float gridSize)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  float fVar4;
  WrappedFloatType<float> WVar5;
  int local_128;
  int i_1;
  int i;
  WrappedFloatType<float> local_e4;
  float local_e0;
  int local_dc;
  int local_d8;
  WrappedFloatType<float> local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  Float local_c4;
  WrappedFloatType<float> local_c0;
  float local_bc;
  int local_b8;
  int local_b4;
  WrappedFloatType<float> local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  Float local_a0;
  WrappedFloatType<float> local_9c;
  float local_98;
  int local_94;
  int local_90;
  WrappedFloatType<float> local_8c;
  float local_88;
  int local_84;
  WrappedFloatType<float> local_80;
  int attemptNdx;
  WrappedFloatType<float> w;
  WrappedFloatType<float> z;
  WrappedFloatType<float> y2;
  WrappedFloatType<float> y1;
  WrappedFloatType<float> x2;
  WrappedFloatType<float> x1;
  int quadNdx;
  WrappedFloatType<float> local_5c;
  WrappedFloatType<float> minDiff;
  WrappedFloatType<float> minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedFloatType<float> max_local;
  WrappedFloatType<float> min_local;
  
  resultData._4_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 4);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._4_4_ = (int)gridSize_local * 6;
  }
  count_local = (int)max.m_value;
  seed_local = (int)min.m_value;
  pcVar2 = (char *)operator_new__((long)(offset + resultData._4_4_ * count));
  deRandom_init((deRandom *)&minDiff,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar3 = gls::GLValue::WrappedFloatType<float>::to<float>
                      ((WrappedFloatType<float> *)&count_local);
    fVar4 = gls::GLValue::WrappedFloatType<float>::to<float>((WrappedFloatType<float> *)&seed_local)
    ;
    fVar3 = deFloatAbs(fVar3 - fVar4);
    local_5c = gls::GLValue::WrappedFloatType<float>::fromFloat(fVar3 * gridSize);
    x1.m_value = (float)minValue<deqp::gls::GLValue::WrappedFloatType<float>>();
    bVar1 = gls::GLValue::WrappedFloatType<float>::operator>(&x1,&local_5c);
    if (bVar1) {
      quadNdx = (int)minValue<deqp::gls::GLValue::WrappedFloatType<float>>();
    }
    else {
      quadNdx = (int)local_5c.m_value;
    }
    for (x2.m_value = 0.0; (int)x2.m_value < count; x2.m_value = x2.m_value + 1) {
      for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
        local_90 = seed_local;
        local_94 = count_local;
        local_8c.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              ((deRandom *)&minDiff,(Float)seed_local,(Float)count_local);
        local_88 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                    ((WrappedFloatType<float> *)&quadNdx,&local_8c);
        local_a0.m_value = (float)quadNdx;
        y1.m_value = local_88;
        local_a8 = (float)gls::GLValue::WrappedFloatType<float>::operator-
                                    ((WrappedFloatType<float> *)&count_local,&y1);
        local_a4 = (float)abs<deqp::gls::GLValue::WrappedFloatType<float>>((Float)local_a8);
        local_9c.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              ((deRandom *)&minDiff,local_a0,(Float)local_a4);
        local_98 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                    ((WrappedFloatType<float> *)&quadNdx,&local_9c);
        local_b4 = seed_local;
        local_b8 = count_local;
        y2.m_value = local_98;
        local_b0.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              ((deRandom *)&minDiff,(Float)seed_local,(Float)count_local);
        local_ac = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                    ((WrappedFloatType<float> *)&quadNdx,&local_b0);
        local_c4.m_value = (float)quadNdx;
        z.m_value = local_ac;
        local_cc = (float)gls::GLValue::WrappedFloatType<float>::operator-
                                    ((WrappedFloatType<float> *)&count_local,&z);
        local_c8 = (float)abs<deqp::gls::GLValue::WrappedFloatType<float>>((Float)local_cc);
        local_c0.m_value =
             (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                              ((deRandom *)&minDiff,local_c4,(Float)local_c8);
        local_bc = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                    ((WrappedFloatType<float> *)&quadNdx,&local_c0);
        w = (WrappedFloatType<float>)local_bc;
        if (componentCount < 3) {
          local_d0 = (float)gls::GLValue::WrappedFloatType<float>::create(0.0);
        }
        else {
          local_d8 = seed_local;
          local_dc = count_local;
          local_d4.m_value =
               (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                                ((deRandom *)&minDiff,(Float)seed_local,(Float)count_local);
          local_d0 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                      ((WrappedFloatType<float> *)&quadNdx,&local_d4);
        }
        attemptNdx = (int)local_d0;
        if (componentCount < 4) {
          local_e0 = (float)gls::GLValue::WrappedFloatType<float>::create(1.0);
        }
        else {
          local_e4.m_value =
               (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                                ((deRandom *)&minDiff,(Float)seed_local,(Float)count_local);
          local_e0 = (float)roundTo<deqp::gls::GLValue::WrappedFloatType<float>>
                                      ((WrappedFloatType<float> *)&quadNdx,&local_e4);
        }
        local_80.m_value = local_e0;
        if (componentCount < 3) break;
        fVar3 = gls::GLValue::WrappedFloatType<float>::to<float>(&y2);
        fVar4 = gls::GLValue::WrappedFloatType<float>::to<float>
                          ((WrappedFloatType<float> *)&attemptNdx);
        fVar3 = deFloatAbs(fVar3 + fVar4);
        fVar4 = gls::GLValue::WrappedFloatType<float>::to<float>
                          ((WrappedFloatType<float> *)&quadNdx);
        if (fVar4 <= fVar3) {
          fVar3 = gls::GLValue::WrappedFloatType<float>::to<float>(&w);
          fVar4 = gls::GLValue::WrappedFloatType<float>::to<float>(&local_80);
          fVar3 = deFloatAbs(fVar3 + fVar4);
          fVar4 = gls::GLValue::WrappedFloatType<float>::to<float>
                            ((WrappedFloatType<float> *)&quadNdx);
          if (fVar4 <= fVar3) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_) + (long)offset,y1);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + 4) + (long)offset,z);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local) +
                          (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local + 4) +
                          (long)offset,z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 2) +
                          (long)offset,y1);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 2 + 4) +
                          (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 3) +
                          (long)offset,y1);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 3 + 4) +
                          (long)offset,WVar5);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 4) +
                          (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 4 + 4) +
                          (long)offset,z);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&y1,&y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 5) +
                          (long)offset,WVar5);
      WVar5 = gls::GLValue::WrappedFloatType<float>::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * 5 + 4) +
                          (long)offset,WVar5);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                    (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ + (int)gridSize_local * i_1
                                    + 8) + (long)offset,(WrappedFloatType<float>)attemptNdx);
        }
      }
      if (3 < componentCount) {
        for (local_128 = 0; local_128 < 6; local_128 = local_128 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<float>>
                    (pcVar2 + (long)((int)x2.m_value * resultData._4_4_ +
                                     (int)gridSize_local * local_128 + 0xc) + (long)offset,local_80)
          ;
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}